

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CGL::GLScene::Mesh::draw_edges(Mesh *this)

{
  bool bVar1;
  Edge *element;
  DrawStyle *pDVar2;
  pointer pVVar3;
  Mesh *in_RDI;
  DrawStyle *style;
  EdgeCIter e;
  Edge *in_stack_ffffffffffffff98;
  HalfedgeCIter in_stack_ffffffffffffffb0;
  _Self local_18;
  _Self local_10 [2];
  
  DrawStyle::style_edge((DrawStyle *)in_stack_ffffffffffffffb0._M_node);
  local_10[0]._M_node =
       (_List_node_base *)HalfedgeMesh::edgesBegin((HalfedgeMesh *)in_stack_ffffffffffffff98);
  while( true ) {
    local_18._M_node =
         (_List_node_base *)HalfedgeMesh::edgesEnd((HalfedgeMesh *)in_stack_ffffffffffffff98);
    bVar1 = std::operator!=(local_10,&local_18);
    if (!bVar1) break;
    element = elementAddress((EdgeCIter)0x12feb7);
    pDVar2 = get_draw_style(in_RDI,&element->super_HalfedgeElement);
    if (pDVar2 != in_RDI->defaultStyle) {
      DrawStyle::style_edge((DrawStyle *)in_stack_ffffffffffffffb0._M_node);
    }
    glBegin(1);
    std::_List_const_iterator<CGL::Edge>::operator->((_List_const_iterator<CGL::Edge> *)0x12fefa);
    Edge::halfedge(in_stack_ffffffffffffff98);
    std::_List_const_iterator<CGL::Halfedge>::operator->
              ((_List_const_iterator<CGL::Halfedge> *)in_RDI);
    Halfedge::vertex((Halfedge *)in_stack_ffffffffffffff98);
    pVVar3 = std::_List_const_iterator<CGL::Vertex>::operator->
                       ((_List_const_iterator<CGL::Vertex> *)in_RDI);
    glVertex3dv(&pVVar3->position);
    std::_List_const_iterator<CGL::Edge>::operator->((_List_const_iterator<CGL::Edge> *)0x12ff3e);
    in_stack_ffffffffffffffb0 = Edge::halfedge(in_stack_ffffffffffffff98);
    std::_List_const_iterator<CGL::Halfedge>::operator->
              ((_List_const_iterator<CGL::Halfedge> *)in_RDI);
    Halfedge::twin((Halfedge *)in_stack_ffffffffffffff98);
    std::_List_const_iterator<CGL::Halfedge>::operator->
              ((_List_const_iterator<CGL::Halfedge> *)in_RDI);
    Halfedge::vertex((Halfedge *)in_stack_ffffffffffffff98);
    pVVar3 = std::_List_const_iterator<CGL::Vertex>::operator->
                       ((_List_const_iterator<CGL::Vertex> *)in_RDI);
    glVertex3dv(&pVVar3->position);
    glEnd();
    if (pDVar2 != in_RDI->defaultStyle) {
      DrawStyle::style_edge((DrawStyle *)in_stack_ffffffffffffffb0._M_node);
    }
    std::_List_const_iterator<CGL::Edge>::operator++(local_10,0);
  }
  DrawStyle::style_reset((DrawStyle *)0x12ffe1);
  return;
}

Assistant:

void Mesh::draw_edges() const {
  defaultStyle->style_edge();
  for(EdgeCIter e = mesh.edgesBegin(); e != mesh.edgesEnd(); e++) {
    DrawStyle *style = get_draw_style(elementAddress(e));
    if (style != defaultStyle) {
      style->style_edge();
    }

    glBegin(GL_LINES);
    glVertex3dv(&e->halfedge()->vertex()->position.x);
    glVertex3dv(&e->halfedge()->twin()->vertex()->position.x);
    glEnd();

    if (style != defaultStyle) {
      defaultStyle->style_edge();
    }
  }
  defaultStyle->style_reset();
}